

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANN.cpp
# Opt level: O0

void __thiscall ANN::~ANN(ANN *this)

{
  vector<Layer_*,_std::allocator<Layer_*>_> *unaff_retaddr;
  
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::vector<Layer_*,_std::allocator<Layer_*>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

ANN::~ANN()
{
    
}